

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall CoinsViews::CoinsViews(CoinsViews *this,DBParams db_params,CoinsViewOptions options)

{
  undefined4 uVar1;
  long lVar2;
  DBParams db_params_00;
  path *__p;
  long in_FS_OFFSET;
  CoinsViewOptions options_00;
  path in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffcc;
  
  options_00._8_8_ = options._8_8_;
  __p = (path *)options.batch_write_bytes;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff98,__p);
  uVar1 = (undefined4)__p[1]._M_pathname._M_string_length;
  db_params_00.cache_bytes = (size_t)__p[1]._M_pathname._M_dataplus._M_p;
  db_params_00.path.super_path = in_stack_ffffffffffffff98;
  db_params_00.memory_only = (bool)(char)uVar1;
  db_params_00.wipe_data = (bool)(char)((uint)uVar1 >> 8);
  db_params_00.obfuscate = (bool)(char)((uint)uVar1 >> 0x10);
  db_params_00.options.force_compact = (bool)(char)((uint)uVar1 >> 0x18);
  db_params_00._52_4_ = in_stack_ffffffffffffffcc;
  options_00.batch_write_bytes = (size_t)&stack0xffffffffffffff98;
  CCoinsViewDB::CCoinsViewDB(&this->m_dbview,db_params_00,options_00);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff98);
  CCoinsViewBacked::CCoinsViewBacked
            (&(this->m_catcherview).super_CCoinsViewBacked,(CCoinsView *)this);
  (this->m_catcherview).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_00b034c8;
  (this->m_catcherview).m_err_callbacks.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_catcherview).m_err_callbacks.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_catcherview).m_err_callbacks.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cacheview)._M_t.
  super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_>._M_t.
  super__Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_>.
  super__Head_base<0UL,_CCoinsViewCache_*,_false>._M_head_impl = (CCoinsViewCache *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CoinsViews::CoinsViews(DBParams db_params, CoinsViewOptions options)
    : m_dbview{std::move(db_params), std::move(options)},
      m_catcherview(&m_dbview) {}